

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlifMv.c
# Opt level: O0

char * Io_MvParseTableMv(Io_MvMod_t *p,Abc_Obj_t *pNode,Vec_Ptr_t *vTokens2,int nInputs,int nOutputs
                        ,int iOut)

{
  Vec_Str_t *p_00;
  int iVar1;
  char *pcVar2;
  int local_58;
  int local_54;
  int i;
  int iStart;
  char *pToken;
  char *pFirst;
  Vec_Str_t *vFunc;
  int iOut_local;
  int nOutputs_local;
  int nInputs_local;
  Vec_Ptr_t *vTokens2_local;
  Abc_Obj_t *pNode_local;
  Io_MvMod_t *p_local;
  
  p_00 = p->pMan->vFunc;
  Vec_StrClear(p_00);
  pcVar2 = (char *)Vec_PtrEntry(vTokens2,0);
  if (*pcVar2 == '.') {
    Vec_StrPush(p_00,'d');
    pcVar2 = (char *)Vec_PtrEntry(vTokens2,iOut + 1);
    iVar1 = Io_MvParseLiteralMv(p,pNode,pcVar2,p_00,-1);
    if (iVar1 == 0) {
      return (char *)0x0;
    }
    local_54 = nOutputs + 1;
  }
  else {
    local_54 = 0;
  }
  while( true ) {
    iVar1 = Vec_PtrSize(vTokens2);
    if (iVar1 <= local_54) {
      Vec_StrPush(p_00,'\0');
      pcVar2 = Vec_StrArray(p_00);
      return pcVar2;
    }
    for (local_58 = 0; local_58 < nInputs; local_58 = local_58 + 1) {
      pcVar2 = (char *)Vec_PtrEntry(vTokens2,local_54 + local_58);
      iVar1 = Io_MvParseLiteralMv(p,pNode,pcVar2,p_00,local_58);
      if (iVar1 == 0) {
        return (char *)0x0;
      }
    }
    pcVar2 = (char *)Vec_PtrEntry(vTokens2,local_54 + nInputs + iOut);
    iVar1 = Io_MvParseLiteralMv(p,pNode,pcVar2,p_00,-1);
    if (iVar1 == 0) break;
    local_54 = nInputs + nOutputs + local_54;
  }
  return (char *)0x0;
}

Assistant:

static char * Io_MvParseTableMv( Io_MvMod_t * p, Abc_Obj_t * pNode, Vec_Ptr_t * vTokens2, int nInputs, int nOutputs, int iOut )
{
    Vec_Str_t * vFunc = p->pMan->vFunc;
    char * pFirst, * pToken;
    int iStart, i;
    // prepare the place for the cover
    Vec_StrClear( vFunc );
    // write the number of values
//    Io_MvWriteValues( pNode, vFunc );
    // get the first token
    pFirst = (char *)Vec_PtrEntry( vTokens2, 0 );
    if ( pFirst[0] == '.' )
    {
        // write the default literal
        Vec_StrPush( vFunc, 'd' );
        pToken = (char *)Vec_PtrEntry(vTokens2, 1 + iOut);
        if ( !Io_MvParseLiteralMv( p, pNode, pToken, vFunc, -1 ) )
            return NULL;
        iStart = 1 + nOutputs;
    }
    else
        iStart = 0;
    // write the remaining literals
    while ( iStart < Vec_PtrSize(vTokens2) )
    {
        // input literals
        for ( i = 0; i < nInputs; i++ )
        {
            pToken = (char *)Vec_PtrEntry( vTokens2, iStart + i );
            if ( !Io_MvParseLiteralMv( p, pNode, pToken, vFunc, i ) )
                return NULL;
        }
        // output literal
        pToken = (char *)Vec_PtrEntry( vTokens2, iStart + nInputs + iOut );
        if ( !Io_MvParseLiteralMv( p, pNode, pToken, vFunc, -1 ) )
            return NULL;
        // update the counter
        iStart += nInputs + nOutputs;
    }       
    Vec_StrPush( vFunc, '\0' );
    return Vec_StrArray( vFunc );
}